

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

config * Configtable_find(config *key)

{
  int iVar1;
  config *pcVar2;
  config *a;
  s_x4node *psVar3;
  
  if (x4a != (s_x4 *)0x0) {
    iVar1 = key->rp->index;
    for (psVar3 = x4a->ht[(long)(iVar1 * 0x25 + key->dot) & (long)x4a->size - 1U];
        psVar3 != (s_x4node *)0x0; psVar3 = psVar3->next) {
      pcVar2 = psVar3->data;
      if ((pcVar2->rp->index == iVar1) && (pcVar2->dot == key->dot)) {
        return pcVar2;
      }
    }
  }
  return (config *)0x0;
}

Assistant:

struct config *Configtable_find(struct config *key)
{
  int h;
  x4node *np;

  if( x4a==0 ) return 0;
  h = confighash(key) & (x4a->size-1);
  np = x4a->ht[h];
  while( np ){
    if( Configcmp((const char *) np->data,(const char *) key)==0 ) break;
    np = np->next;
  }
  return np ? np->data : 0;
}